

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_PackedParsing_Test::TestBody
          (ExtensionSetTest_PackedParsing_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_1f0;
  AssertHelper local_1d0;
  Message local_1c8;
  string_view local_1c0;
  bool local_1a9;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_;
  string data;
  undefined1 local_168 [8];
  TestPackedExtensions destination;
  TestPackedTypes source;
  ExtensionSetTest_PackedParsing_Test *this_local;
  
  proto2_unittest::TestPackedTypes::TestPackedTypes
            ((TestPackedTypes *)&destination.field_0._impl_._cached_size_);
  proto2_unittest::TestPackedExtensions::TestPackedExtensions((TestPackedExtensions *)local_168);
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  TestUtil::SetPackedFields<proto2_unittest::TestPackedTypes>
            ((TestPackedTypes *)&destination.field_0._impl_._cached_size_);
  protobuf::MessageLite::SerializeToString
            ((MessageLite *)&destination.field_0._impl_._cached_size_,(string *)&gtest_ar_.message_)
  ;
  local_1c0 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&gtest_ar_.message_);
  local_1a9 = protobuf::MessageLite::ParseFromString((MessageLite *)local_168,local_1c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a8,&local_1a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f0,(internal *)local_1a8,
               (AssertionResult *)"destination.ParseFromString(data)","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x297,message);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  TestUtil::ExpectPackedExtensionsSet<proto2_unittest::TestPackedExtensions>
            ((TestPackedExtensions *)local_168);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  proto2_unittest::TestPackedExtensions::~TestPackedExtensions((TestPackedExtensions *)local_168);
  proto2_unittest::TestPackedTypes::~TestPackedTypes
            ((TestPackedTypes *)&destination.field_0._impl_._cached_size_);
  return;
}

Assistant:

TEST(ExtensionSetTest, PackedParsing) {
  // Serialize as TestPackedTypes and parse as TestPackedExtensions.
  unittest::TestPackedTypes source;
  unittest::TestPackedExtensions destination;
  std::string data;

  TestUtil::SetPackedFields(&source);
  source.SerializeToString(&data);
  EXPECT_TRUE(destination.ParseFromString(data));
  TestUtil::ExpectPackedExtensionsSet(destination);
}